

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

int __thiscall Min2<0>::checkSatisfied(Min2<0> *this)

{
  int iVar1;
  int iVar2;
  
  if ((this->super_Propagator).satisfied.v == '\0') {
    iVar1 = (((this->z).var)->min).v;
    iVar2 = 3;
    if ((iVar1 == (((this->x).var)->max).v) || (iVar1 == (((this->y).var)->max).v)) {
      Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (z.getMin() == x.getMax() || z.getMin() == y.getMax()) {
			satisfied = true;
		}
		return 3;
	}